

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

int Sfm_TimSortArrayByArrival(Sfm_Tim_t *p,Vec_Int_t *vNodes,int iPivot)

{
  int iVar1;
  int iVar2;
  int iVar3;
  word *pData;
  word wVar4;
  int local_34;
  int MaxDelay;
  int nDivNew;
  int Id;
  int i;
  word Entry;
  int iPivot_local;
  Vec_Int_t *vNodes_local;
  Sfm_Tim_t *p_local;
  
  local_34 = -1;
  iVar1 = Sfm_TimArrMaxId(p,iPivot);
  if (p->DeltaCrit < 1) {
    __assert_fail("p->DeltaCrit > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmTim.c"
                  ,0x155,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  Vec_WrdClear(&p->vSortData);
  for (nDivNew = 0; iVar2 = Vec_IntSize(vNodes), nDivNew < iVar2; nDivNew = nDivNew + 1) {
    iVar2 = Vec_IntEntry(vNodes,nDivNew);
    iVar3 = Sfm_TimArrMaxId(p,iVar2);
    Vec_WrdPush(&p->vSortData,(long)iVar2 << 0x20 | (long)iVar3);
  }
  pData = Vec_WrdArray(&p->vSortData);
  iVar2 = Vec_WrdSize(&p->vSortData);
  Abc_QuickSort3(pData,iVar2,0);
  Vec_IntClear(vNodes);
  for (nDivNew = 0; iVar2 = Vec_WrdSize(&p->vSortData), nDivNew < iVar2; nDivNew = nDivNew + 1) {
    wVar4 = Vec_WrdEntry(&p->vSortData,nDivNew);
    Vec_IntPush(vNodes,(int)(wVar4 >> 0x20));
    if ((local_34 == -1) && (iVar1 < (int)wVar4 + p->DeltaCrit)) {
      local_34 = nDivNew;
    }
  }
  return local_34;
}

Assistant:

int Sfm_TimSortArrayByArrival( Sfm_Tim_t * p, Vec_Int_t * vNodes, int iPivot )
{
    word Entry; 
    int i, Id, nDivNew = -1; 
    int MaxDelay = Sfm_TimArrMaxId(p, iPivot);
    assert( p->DeltaCrit > 0 );
    // collect nodes
    Vec_WrdClear( &p->vSortData );
    Vec_IntForEachEntry( vNodes, Id, i )
        Vec_WrdPush( &p->vSortData, ((word)Id << 32) | Sfm_TimArrMaxId(p, Id) );
    // sort nodes by delay
    Abc_QuickSort3( Vec_WrdArray(&p->vSortData), Vec_WrdSize(&p->vSortData), 0 );
    // collect sorted nodes and find place where divisors end
    Vec_IntClear( vNodes );
    Vec_WrdForEachEntry( &p->vSortData, Entry, i )
    {
        Vec_IntPush( vNodes, (int)(Entry >> 32) );
        if ( nDivNew == -1 && ((int)Entry) + p->DeltaCrit > MaxDelay )
            nDivNew = i;
    }
    return nDivNew;
}